

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::compare_types_cast<long_double,long_double>
               (_func_longdouble_longdouble *param_1,Function_Params *params,
               Type_Conversions_State *t_conversions)

{
  Boxed_Value *__return_storage_ptr__;
  Type_Conversions_State *t_conversions_00;
  bad_boxed_cast *anon_var_0;
  size_type i;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  _func_longdouble_longdouble *param_0_local;
  
  __return_storage_ptr__ = Function_Params::operator[](params,0);
  boxed_cast<long_double>
            ((longdouble *)__return_storage_ptr__,(Boxed_Value *)t_conversions,t_conversions_00);
  return true;
}

Assistant:

bool compare_types_cast(Ret (*)(Params...), const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) noexcept {
        try {
          std::vector<Boxed_Value>::size_type i = 0;
          (boxed_cast<Params>(params[i++], &t_conversions), ...);
          return true;
        } catch (const exception::bad_boxed_cast &) {
          return false;
        }
      }